

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate1<std::complex<float>_>::QRotationGate1
          (QRotationGate1<std::complex<float>_> *this)

{
  QRotationGate1<std::complex<float>_> *this_local;
  
  QGate1<std::complex<float>_>::QGate1(&this->super_QGate1<std::complex<float>_>,0);
  QAdjustable::QAdjustable
            ((QAdjustable *)&(this->super_QGate1<std::complex<float>_>).field_0xc,false);
  (this->super_QGate1<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0016bd60;
  QRotation<float>::QRotation(&this->rotation_);
  return;
}

Assistant:

QRotationGate1()
        : QGate1< T >( 0 )
        , rotation_()
        , QAdjustable()
        { }